

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Vertex * pbrt::Vertex::CreateLight
                   (Vertex *__return_storage_ptr__,LightHandle *light,Ray *ray,SampledSpectrum *Le,
                   Float pdf)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 local_60 [16];
  Interval local_50;
  Float local_48;
  undefined1 local_44 [32];
  MediumInterface *local_20;
  MediumHandle local_18;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_10;
  
  uVar2 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar4._4_4_ = uVar3;
  auVar4._0_4_ = uVar2;
  auVar4._8_8_ = 0;
  fVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._4_4_ = fVar1;
  auVar5._0_4_ = fVar1;
  auVar5._8_4_ = fVar1;
  auVar5._12_4_ = fVar1;
  local_48 = ray->time;
  local_10.light.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (LightHandle)
          (light->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  local_18.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(ray->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_60 = vshufps_avx(auVar4,auVar4,0x50);
  local_50 = (Interval)vmovlps_avx(auVar5);
  local_44 = ZEXT832(0) << 0x20;
  local_20 = (MediumInterface *)0x0;
  Vertex(__return_storage_ptr__,Light,(EndpointInteraction *)local_60,Le);
  __return_storage_ptr__->pdfFwd = pdf;
  return __return_storage_ptr__;
}

Assistant:

inline Vertex Vertex::CreateLight(LightHandle light, const Ray &ray,
                                  const SampledSpectrum &Le, Float pdf) {
    Vertex v(VertexType::Light, EndpointInteraction(light, ray), Le);
    v.pdfFwd = pdf;
    return v;
}